

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ParquetWriteBind
          (duckdb *this,ClientContext *context,CopyFunctionBindInput *input,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types)

{
  vector<duckdb::Value,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar1;
  int iVar2;
  ParquetWriteBindData *this_02;
  pointer pPVar3;
  undefined8 uVar4;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *__x;
  reference pvVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  const_reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  idx_t iVar10;
  ulong uVar11;
  int64_t iVar12;
  long lVar13;
  BinderException *pBVar14;
  int64_t params_1;
  NotImplementedException *this_03;
  ParquetVersion PVar15;
  type tVar16;
  ulong uVar17;
  size_type __n;
  size_type __n_00;
  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
  *this_04;
  long *plVar18;
  bool bVar19;
  string roption;
  templated_unique_single_t bind_data;
  case_insensitive_map_t<LogicalType> name_to_type_map;
  vector<duckdb::Value,_true> values;
  string loption;
  undefined1 local_198 [32];
  float local_178;
  size_type local_170;
  undefined1 auStack_168 [32];
  undefined1 local_148 [32];
  float local_128;
  size_t local_120;
  __node_base _Stack_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_108;
  ulong local_100;
  ClientContext *local_f8;
  ulong local_f0;
  ulong local_e8;
  string local_e0;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  double local_a0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_108 = &sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  local_f8 = context;
  this_02 = (ParquetWriteBindData *)operator_new(0xd0);
  memset(this_02,0,0xd0);
  ParquetWriteBindData::ParquetWriteBindData(this_02);
  plVar18 = *(long **)(*(long *)input + 0xe0);
  auStack_168._24_8_ = this_02;
  if (plVar18 == (long *)0x0) {
    uVar11 = 0;
    uVar17 = 0;
  }
  else {
    local_f0 = 0;
    local_100 = 0;
    local_e8 = 0;
    local_110 = &names->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    local_98._M_head_impl = (FunctionData *)this;
    do {
      this_04 = (unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                 *)(auStack_168 + 0x18);
      duckdb::StringUtil::Lower((string *)&local_c0);
      if (plVar18[6] - plVar18[5] != 0x40) {
        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
        local_198._0_8_ = local_198 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_198,"%s requires exactly one argument","");
        duckdb::StringUtil::Upper((string *)&local_50);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar14,(string *)local_198,&local_50);
        __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (vector<duckdb::Value,_true> *)(plVar18 + 5);
      iVar2 = std::__cxx11::string::compare((char *)&local_c0);
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_c0), iVar2 == 0)) {
        vector<duckdb::Value,_true>::operator[](this_00,0);
        uVar11 = duckdb::Value::GetValue<unsigned_long>();
        pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                 ::operator->(this_04);
        pPVar3->row_group_size = uVar11;
        if ((local_e8 & 1) == 0) {
          pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->(this_04);
          pPVar3->dictionary_size_limit = pPVar3->row_group_size / 0x14;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar2 == 0) {
          pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
          duckdb::Value::Value((Value *)local_198,pvVar9);
          if (local_198[0] == (string)0x19) {
            duckdb::Value::ToString_abi_cxx11_();
            iVar10 = duckdb::DBConfig::ParseMemoryLimit((string *)local_148);
            pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                     ::operator->(this_04);
            pPVar3->row_group_size_bytes = iVar10;
            if ((__node_base *)local_148._0_8_ != (__node_base *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_);
            }
          }
          else {
            vector<duckdb::Value,_true>::operator[](this_00,0);
            uVar11 = duckdb::Value::GetValue<unsigned_long>();
            pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                     ::operator->(this_04);
            pPVar3->row_group_size_bytes = uVar11;
          }
          uVar4 = duckdb::Value::~Value((Value *)local_198);
          local_f0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar2 == 0) {
            vector<duckdb::Value,_true>::operator[](this_00,0);
            uVar11 = duckdb::Value::GetValue<unsigned_long>();
            optional_idx::optional_idx((optional_idx *)local_198,uVar11);
            pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                     ::operator->(this_04);
            (pPVar3->row_groups_per_file).index = local_198._0_8_;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_c0);
            if ((iVar2 == 0) ||
               (iVar2 = std::__cxx11::string::compare((char *)&local_c0), iVar2 == 0)) {
              vector<duckdb::Value,_true>::operator[](this_00,0);
              duckdb::Value::ToString_abi_cxx11_();
              duckdb::StringUtil::Lower((string *)local_198);
              if ((__node_base *)local_148._0_8_ != (__node_base *)(local_148 + 0x10)) {
                operator_delete((void *)local_148._0_8_);
              }
              iVar2 = std::__cxx11::string::compare(local_198);
              if (iVar2 == 0) {
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                tVar16 = UNCOMPRESSED;
              }
              else {
                iVar2 = std::__cxx11::string::compare(local_198);
                if (iVar2 == 0) {
                  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                           ::operator->(this_04);
                  tVar16 = SNAPPY;
                }
                else {
                  iVar2 = std::__cxx11::string::compare(local_198);
                  if (iVar2 == 0) {
                    pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             ::operator->(this_04);
                    tVar16 = GZIP;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare(local_198);
                    if (iVar2 == 0) {
                      pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->(this_04);
                      tVar16 = ZSTD;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare(local_198);
                      if (iVar2 == 0) {
                        pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                 ::operator->(this_04);
                        tVar16 = BROTLI;
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare(local_198);
                        if ((iVar2 != 0) &&
                           (iVar2 = std::__cxx11::string::compare(local_198), iVar2 != 0)) {
                          pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                          local_148._0_8_ = local_148 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_148,
                                     "Expected %s argument to be either [uncompressed, brotli, gzip, snappy, or zstd]"
                                     ,"");
                          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_70,local_c0,local_c0 + local_b8);
                          BinderException::BinderException<std::__cxx11::string>
                                    (pBVar14,(string *)local_148,&local_70);
                          __cxa_throw(pBVar14,&BinderException::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                 ::operator->(this_04);
                        tVar16 = LZ4_RAW;
                      }
                    }
                  }
                }
              }
              pPVar3->codec = tVar16;
              goto LAB_0027dee5;
            }
            iVar2 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar2 == 0) {
              pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
              if (*pvVar9 == (value_type)0x19) {
                pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
                duckdb::StringValue::Get_abi_cxx11_(pvVar9);
                duckdb::StringUtil::Lower((string *)local_90);
                iVar2 = std::__cxx11::string::compare((char *)local_90);
                bVar19 = iVar2 == 0;
                if (local_90[0] != local_80) {
                  operator_delete(local_90[0]);
                }
              }
              else {
                bVar19 = false;
              }
              if (bVar19) {
                local_198._0_8_ = (element_type *)0x0;
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                GenerateFieldIDs(&pPVar3->field_ids,(idx_t *)local_198,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)local_110,(vector<duckdb::LogicalType,_true> *)local_108);
              }
              else {
                local_198._0_8_ = auStack_168;
                local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
                local_198._16_8_ = 0;
                local_198._24_8_ = 0;
                local_178 = 1.0;
                local_170 = 0;
                auStack_168._0_8_ = (_Hash_node_base *)0x0;
                local_148._0_8_ = &_Stack_118;
                local_148._8_8_ = 1;
                local_148._16_8_ = 0;
                local_148._24_8_ = 0;
                local_128 = 1.0;
                local_120 = 0;
                _Stack_118._M_nxt = (__node_base_ptr)0x0;
                if ((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&(local_110->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl)->_M_impl).super__Vector_impl_data._M_finish !=
                    (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&(local_110->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl)->_M_impl).super__Vector_impl_data._M_start) {
                  __n_00 = 0;
                  do {
                    pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                           *)local_110,__n_00);
                    iVar2 = std::__cxx11::string::compare((char *)pvVar7);
                    if (iVar2 == 0) {
                      pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e0,
                                 "Cannot have a column named \"%s\" when writing FIELD_IDS","");
                      BinderException::BinderException<char_const*>
                                (pBVar14,&local_e0,"__duckdb_field_id");
                      __cxa_throw(pBVar14,&BinderException::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                           *)local_110,__n_00);
                    pvVar8 = vector<duckdb::LogicalType,_true>::operator[]
                                       ((vector<duckdb::LogicalType,_true> *)local_108,__n_00);
                    std::
                    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    ::_M_emplace<std::__cxx11::string_const&,duckdb::LogicalType_const&>
                              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                *)local_148,pvVar7,pvVar8);
                    __n_00 = __n_00 + 1;
                  } while (__n_00 < (ulong)((long)(((
                                                  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&(local_110->
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl)->_M_impl).super__Vector_impl_data.
                                                  _M_finish -
                                            (long)(((
                                                  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&(local_110->
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl)->_M_impl).super__Vector_impl_data.
                                                  _M_start >> 5));
                }
                pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                GetFieldIDs(pvVar9,&pPVar3->field_ids,
                            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_198,(case_insensitive_map_t<LogicalType> *)local_148);
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)local_148);
                std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)local_198);
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_c0);
              if (iVar2 == 0) {
                pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
                if (*pvVar9 != (value_type)0x64) {
                  pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                  local_198._0_8_ = local_198 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_198,"Expected kv_metadata argument to be a STRUCT","");
                  duckdb::BinderException::BinderException(pBVar14,(string *)local_198);
                  __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                __x = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                      duckdb::StructValue::GetChildren(pvVar9);
                std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                          ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e0,__x);
                if ((pointer)local_e0._M_string_length != local_e0._M_dataplus._M_p) {
                  __n = 0;
                  do {
                    pvVar5 = vector<duckdb::Value,_true>::operator[]
                                       ((vector<duckdb::Value,_true> *)&local_e0,__n);
                    plVar6 = (long *)duckdb::StructType::GetChildName_abi_cxx11_
                                               ((LogicalType *)pvVar9,__n);
                    local_198._0_8_ = local_198 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_198,*plVar6,plVar6[1] + *plVar6);
                    if (*pvVar5 == (value_type)0x1a) {
                      pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                             *)(auStack_168 + 0x18));
                      __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)duckdb::StringValue::Get_abi_cxx11_(pvVar5);
                      std::
                      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string&,std::__cxx11::string_const&>
                                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                  *)&pPVar3->kv_metadata,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_198,__args_1);
                    }
                    else {
                      pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                             *)(auStack_168 + 0x18));
                      duckdb::Value::ToString_abi_cxx11_();
                      std::
                      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      ::emplace_back<std::__cxx11::string&,std::__cxx11::string>
                                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                  *)&pPVar3->kv_metadata,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_198,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_148);
                      if ((__node_base *)local_148._0_8_ != (__node_base *)(local_148 + 0x10)) {
                        operator_delete((void *)local_148._0_8_);
                      }
                    }
                    if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
                      operator_delete((void *)local_198._0_8_);
                    }
                    __n = __n + 1;
                  } while (__n < (ulong)((long)(local_e0._M_string_length -
                                               (long)local_e0._M_dataplus._M_p) >> 6));
                }
                std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                          ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e0);
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_c0);
                if (iVar2 == 0) {
                  pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
                  ParquetEncryptionConfig::Create
                            ((ParquetEncryptionConfig *)local_198,local_f8,pvVar9);
                  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                           ::operator->(this_04);
                  uVar1 = local_198._8_8_;
                  uVar4 = local_198._0_8_;
                  local_198._0_8_ = (element_type *)0x0;
                  local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this_01 = (pPVar3->encryption_config).internal.
                            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (pPVar3->encryption_config).internal.
                  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)uVar4;
                  (pPVar3->encryption_config).internal.
                  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
                  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
                  }
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)&local_c0);
                  if (iVar2 != 0) {
                    iVar2 = std::__cxx11::string::compare((char *)&local_c0);
                    if (iVar2 == 0) {
                      vector<duckdb::Value,_true>::operator[](this_00,0);
                      iVar10 = duckdb::Value::GetValue<long>();
                      if ((long)iVar10 < 0) {
                        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                        local_198._0_8_ = local_198 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_198,
                                   "dictionary_size_limit must be greater than 0 or 0 to disable",""
                                  );
                        duckdb::BinderException::BinderException(pBVar14,(string *)local_198);
                        __cxa_throw(pBVar14,&BinderException::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->(this_04);
                      pPVar3->dictionary_size_limit = iVar10;
                      local_e8 = CONCAT71((int7)((ulong)pPVar3 >> 8),1);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)&local_c0);
                      if (iVar2 == 0) {
                        vector<duckdb::Value,_true>::operator[](this_00,0);
                        uVar11 = duckdb::Value::GetValue<unsigned_long>();
                        if (uVar11 - 0x40000001 < 0xffffffffc0000000) {
                          pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                          local_198._0_8_ = local_198 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_198,
                                     "string_dictionary_page_size_limit cannot be 0 and must be less than or equal to %llu"
                                     ,"");
                          BinderException::BinderException<unsigned_long>
                                    (pBVar14,(string *)local_198,0x40000000);
                          __cxa_throw(pBVar14,&BinderException::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                 ::operator->(this_04);
                        pPVar3->string_dictionary_page_size_limit = uVar11;
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)&local_c0);
                        if (iVar2 == 0) {
                          vector<duckdb::Value,_true>::operator[](this_00,0);
                          local_a0 = duckdb::Value::GetValue<double>();
                          if (local_a0 <= 0.0) {
                            pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                            local_198._0_8_ = local_198 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_198,
                                       "bloom_filter_false_positive_ratio must be greater than 0",""
                                      );
                            duckdb::BinderException::BinderException(pBVar14,(string *)local_198);
                            __cxa_throw(pBVar14,&BinderException::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                   ::operator->(this_04);
                          pPVar3->bloom_filter_false_positive_ratio = local_a0;
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)&local_c0);
                          if (iVar2 == 0) {
                            vector<duckdb::Value,_true>::operator[](this_00,0);
                            duckdb::Value::GetValue<std::__cxx11::string>();
                            duckdb::StringUtil::Lower((string *)local_198);
                            if ((__node_base *)local_148._0_8_ != (__node_base *)(local_148 + 0x10))
                            {
                              operator_delete((void *)local_148._0_8_);
                            }
                            iVar2 = std::__cxx11::string::compare(local_198);
                            if (iVar2 == 0) {
                              pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                       ::operator->(this_04);
                              bVar19 = false;
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare(local_198);
                              if (iVar2 != 0) {
                                pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                                local_148._0_8_ = local_148 + 0x10;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_148,
                                           "Expected debug_use_openssl to be a BOOLEAN","");
                                duckdb::BinderException::BinderException
                                          (pBVar14,(string *)local_148);
                                __cxa_throw(pBVar14,&BinderException::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                       ::operator->(this_04);
                              bVar19 = true;
                            }
                            pPVar3->debug_use_openssl = bVar19;
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)&local_c0);
                            if (iVar2 == 0) {
                              vector<duckdb::Value,_true>::operator[](this_00,0);
                              lVar13 = duckdb::Value::GetValue<long>();
                              iVar12 = ZStdFileSystem::MinimumCompressionLevel();
                              if ((lVar13 < iVar12) ||
                                 (iVar12 = ZStdFileSystem::MaximumCompressionLevel(),
                                 iVar12 < lVar13)) {
                                pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                                local_198._0_8_ = local_198 + 0x10;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_198,
                                           "Compression level must be between %lld and %lld","");
                                iVar12 = ZStdFileSystem::MinimumCompressionLevel();
                                params_1 = ZStdFileSystem::MaximumCompressionLevel();
                                BinderException::BinderException<long,long>
                                          (pBVar14,(string *)local_198,iVar12,params_1);
                                __cxa_throw(pBVar14,&BinderException::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                       ::operator->(this_04);
                              pPVar3->compression_level = lVar13;
                              local_100 = CONCAT71((int7)((ulong)pPVar3 >> 8),1);
                              goto LAB_0027def8;
                            }
                            iVar2 = std::__cxx11::string::compare((char *)&local_c0);
                            if (iVar2 != 0) {
                              this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                              local_198._0_8_ = local_198 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_198,"Unrecognized option for PARQUET: %s",
                                         "");
                              NotImplementedException::NotImplementedException<char_const*>
                                        (this_03,(string *)local_198,(char *)plVar18[1]);
                              __cxa_throw(this_03,&NotImplementedException::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            vector<duckdb::Value,_true>::operator[](this_00,0);
                            duckdb::Value::ToString_abi_cxx11_();
                            duckdb::StringUtil::Upper((string *)local_198);
                            if ((__node_base *)local_148._0_8_ != (__node_base *)(local_148 + 0x10))
                            {
                              operator_delete((void *)local_148._0_8_);
                            }
                            iVar2 = std::__cxx11::string::compare(local_198);
                            if (iVar2 == 0) {
                              pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                       ::operator->(this_04);
                              PVar15 = V1;
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare(local_198);
                              if (iVar2 != 0) {
                                pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                                local_148._0_8_ = local_148 + 0x10;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_148,
                                           "Expected parquet_version \'V1\' or \'V2\'","");
                                duckdb::BinderException::BinderException
                                          (pBVar14,(string *)local_148);
                                __cxa_throw(pBVar14,&BinderException::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                       ::operator->(this_04);
                              PVar15 = V2;
                            }
                            pPVar3->parquet_version = PVar15;
                          }
LAB_0027dee5:
                          if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10))
                          {
                            operator_delete((void *)local_198._0_8_);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0027def8:
      if (local_c0 != local_b0) {
        operator_delete(local_c0);
      }
      plVar18 = (long *)*plVar18;
      uVar11 = local_f0;
      uVar17 = local_100;
      this = (duckdb *)local_98._M_head_impl;
      names = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)local_110;
    } while (plVar18 != (long *)0x0);
  }
  if (((uVar11 & 1) != 0) &&
     (lVar13 = duckdb::DBConfig::GetConfig(local_f8), *(char *)(lVar13 + 0x2b8) == '\x01')) {
    pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,
               "ROW_GROUP_SIZE_BYTES does not work while preserving insertion order. Use \"SET preserve_insertion_order=false;\" to disable preserving insertion order."
               ,"");
    duckdb::BinderException::BinderException(pBVar14,(string *)local_198);
    __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((uVar17 & 1) != 0) &&
     (pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             *)(auStack_168 + 0x18)), pPVar3->codec != ZSTD)) {
    pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,
               "Compression level is only supported for the ZSTD compression codec","");
    duckdb::BinderException::BinderException(pBVar14,(string *)local_198);
    __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         *)(auStack_168 + 0x18));
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pPVar3->sql_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,local_108);
  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         *)(auStack_168 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(pPVar3->column_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,&names->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  *(undefined8 *)this = auStack_168._24_8_;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> ParquetWriteBind(ClientContext &context, CopyFunctionBindInput &input,
                                          const vector<string> &names, const vector<LogicalType> &sql_types) {
	D_ASSERT(names.size() == sql_types.size());
	bool row_group_size_bytes_set = false;
	bool compression_level_set = false;
	bool dictionary_size_limit_set = false;
	auto bind_data = make_uniq<ParquetWriteBindData>();
	for (auto &option : input.info.options) {
		const auto loption = StringUtil::Lower(option.first);
		if (option.second.size() != 1) {
			// All parquet write options require exactly one argument
			throw BinderException("%s requires exactly one argument", StringUtil::Upper(loption));
		}
		if (loption == "row_group_size" || loption == "chunk_size") {
			bind_data->row_group_size = option.second[0].GetValue<uint64_t>();
			if (!dictionary_size_limit_set) {
				bind_data->SetToDefaultDictionarySizeLimit();
			}
		} else if (loption == "row_group_size_bytes") {
			auto roption = option.second[0];
			if (roption.GetTypeMutable().id() == LogicalTypeId::VARCHAR) {
				bind_data->row_group_size_bytes = DBConfig::ParseMemoryLimit(roption.ToString());
			} else {
				bind_data->row_group_size_bytes = option.second[0].GetValue<uint64_t>();
			}
			row_group_size_bytes_set = true;
		} else if (loption == "row_groups_per_file") {
			bind_data->row_groups_per_file = option.second[0].GetValue<uint64_t>();
		} else if (loption == "compression" || loption == "codec") {
			const auto roption = StringUtil::Lower(option.second[0].ToString());
			if (roption == "uncompressed") {
				bind_data->codec = duckdb_parquet::CompressionCodec::UNCOMPRESSED;
			} else if (roption == "snappy") {
				bind_data->codec = duckdb_parquet::CompressionCodec::SNAPPY;
			} else if (roption == "gzip") {
				bind_data->codec = duckdb_parquet::CompressionCodec::GZIP;
			} else if (roption == "zstd") {
				bind_data->codec = duckdb_parquet::CompressionCodec::ZSTD;
			} else if (roption == "brotli") {
				bind_data->codec = duckdb_parquet::CompressionCodec::BROTLI;
			} else if (roption == "lz4" || roption == "lz4_raw") {
				/* LZ4 is technically another compression scheme, but deprecated and arrow also uses them
				 * interchangeably */
				bind_data->codec = duckdb_parquet::CompressionCodec::LZ4_RAW;
			} else {
				throw BinderException("Expected %s argument to be either [uncompressed, brotli, gzip, snappy, or zstd]",
				                      loption);
			}
		} else if (loption == "field_ids") {
			if (option.second[0].type().id() == LogicalTypeId::VARCHAR &&
			    StringUtil::Lower(StringValue::Get(option.second[0])) == "auto") {
				idx_t field_id = 0;
				GenerateFieldIDs(bind_data->field_ids, field_id, names, sql_types);
			} else {
				unordered_set<uint32_t> unique_field_ids;
				case_insensitive_map_t<LogicalType> name_to_type_map;
				for (idx_t col_idx = 0; col_idx < names.size(); col_idx++) {
					if (names[col_idx] == FieldID::DUCKDB_FIELD_ID) {
						throw BinderException("Cannot have a column named \"%s\" when writing FIELD_IDS",
						                      FieldID::DUCKDB_FIELD_ID);
					}
					name_to_type_map.emplace(names[col_idx], sql_types[col_idx]);
				}
				GetFieldIDs(option.second[0], bind_data->field_ids, unique_field_ids, name_to_type_map);
			}
		} else if (loption == "kv_metadata") {
			auto &kv_struct = option.second[0];
			auto &kv_struct_type = kv_struct.type();
			if (kv_struct_type.id() != LogicalTypeId::STRUCT) {
				throw BinderException("Expected kv_metadata argument to be a STRUCT");
			}
			auto values = StructValue::GetChildren(kv_struct);
			for (idx_t i = 0; i < values.size(); i++) {
				auto &value = values[i];
				auto key = StructType::GetChildName(kv_struct_type, i);
				// If the value is a blob, write the raw blob bytes
				// otherwise, cast to string
				if (value.type().id() == LogicalTypeId::BLOB) {
					bind_data->kv_metadata.emplace_back(key, StringValue::Get(value));
				} else {
					bind_data->kv_metadata.emplace_back(key, value.ToString());
				}
			}
		} else if (loption == "encryption_config") {
			bind_data->encryption_config = ParquetEncryptionConfig::Create(context, option.second[0]);
		} else if (loption == "dictionary_compression_ratio_threshold") {
			// deprecated, ignore setting
		} else if (loption == "dictionary_size_limit") {
			auto val = option.second[0].GetValue<int64_t>();
			if (val < 0) {
				throw BinderException("dictionary_size_limit must be greater than 0 or 0 to disable");
			}
			bind_data->dictionary_size_limit = val;
			dictionary_size_limit_set = true;
		} else if (loption == "string_dictionary_page_size_limit") {
			auto val = option.second[0].GetValue<uint64_t>();
			if (val > PrimitiveColumnWriter::MAX_UNCOMPRESSED_DICT_PAGE_SIZE || val == 0) {
				throw BinderException(
				    "string_dictionary_page_size_limit cannot be 0 and must be less than or equal to %llu",
				    PrimitiveColumnWriter::MAX_UNCOMPRESSED_DICT_PAGE_SIZE);
			}
			bind_data->string_dictionary_page_size_limit = val;
		} else if (loption == "bloom_filter_false_positive_ratio") {
			auto val = option.second[0].GetValue<double>();
			if (val <= 0) {
				throw BinderException("bloom_filter_false_positive_ratio must be greater than 0");
			}
			bind_data->bloom_filter_false_positive_ratio = val;
		} else if (loption == "debug_use_openssl") {
			auto val = StringUtil::Lower(option.second[0].GetValue<std::string>());
			if (val == "false") {
				bind_data->debug_use_openssl = false;
			} else if (val == "true") {
				bind_data->debug_use_openssl = true;
			} else {
				throw BinderException("Expected debug_use_openssl to be a BOOLEAN");
			}
		} else if (loption == "compression_level") {
			const auto val = option.second[0].GetValue<int64_t>();
			if (val < ZStdFileSystem::MinimumCompressionLevel() || val > ZStdFileSystem::MaximumCompressionLevel()) {
				throw BinderException("Compression level must be between %lld and %lld",
				                      ZStdFileSystem::MinimumCompressionLevel(),
				                      ZStdFileSystem::MaximumCompressionLevel());
			}
			bind_data->compression_level = val;
			compression_level_set = true;
		} else if (loption == "parquet_version") {
			const auto roption = StringUtil::Upper(option.second[0].ToString());
			if (roption == "V1") {
				bind_data->parquet_version = ParquetVersion::V1;
			} else if (roption == "V2") {
				bind_data->parquet_version = ParquetVersion::V2;
			} else {
				throw BinderException("Expected parquet_version 'V1' or 'V2'");
			}
		} else {
			throw NotImplementedException("Unrecognized option for PARQUET: %s", option.first.c_str());
		}
	}
	if (row_group_size_bytes_set) {
		if (DBConfig::GetConfig(context).options.preserve_insertion_order) {
			throw BinderException("ROW_GROUP_SIZE_BYTES does not work while preserving insertion order. Use \"SET "
			                      "preserve_insertion_order=false;\" to disable preserving insertion order.");
		}
	}

	if (compression_level_set && bind_data->codec != CompressionCodec::ZSTD) {
		throw BinderException("Compression level is only supported for the ZSTD compression codec");
	}

	bind_data->sql_types = sql_types;
	bind_data->column_names = names;
	return std::move(bind_data);
}